

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

vector3 * vector3_reflect_by_quaternion(vector3 *self,quaternion *qT)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  quaternion q;
  anon_union_16_3_07544b10_for_quaternion_0 local_20;
  
  fVar6 = (qT->field_0).q[0];
  fVar7 = (qT->field_0).q[1];
  fVar1 = (qT->field_0).q[2];
  fVar2 = (qT->field_0).q[3];
  fVar3 = (self->field_0).v[2];
  fVar4 = (self->field_0).v[0];
  fVar5 = (self->field_0).v[1];
  local_20.q[0] = (fVar2 * fVar4 + fVar7 * fVar3) - fVar1 * fVar5;
  local_20.q[1] = fVar1 * fVar4 + (fVar2 * fVar5 - fVar3 * fVar6);
  local_20.q[2] = (fVar2 * fVar3 + fVar6 * fVar5) - fVar7 * fVar4;
  local_20.q[3] = (fVar6 * fVar4 - fVar5 * fVar7) - fVar1 * fVar3;
  quaternion_multiply((quaternion *)&local_20.field_1,qT);
  fVar6 = local_20.q[3] * local_20.q[3] +
          local_20.q[2] * local_20.q[2] +
          local_20.q[0] * local_20.q[0] + local_20.q[1] * local_20.q[1];
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  fVar7 = -fVar6;
  if (-fVar6 <= fVar6) {
    fVar7 = fVar6;
  }
  if (1e-05 <= fVar7) {
    local_20.q[0] = local_20.q[0] / fVar6;
    local_20.q[1] = local_20.q[1] / fVar6;
    local_20.q[2] = local_20.q[2] / fVar6;
  }
  (self->field_0).v[0] = local_20.q[0];
  (self->field_0).v[1] = local_20.q[1];
  (self->field_0).v[2] = local_20.q[2];
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_reflect_by_quaternion(struct vector3 *self, const struct quaternion *qT)
{
	struct quaternion q;

	quaternion_set(&q, qT);
	quaternion_multiplyv3(&q, self);
	quaternion_multiply(&q, qT);

	/* this seems to be necessary */
	quaternion_normalize(&q);

	self->x = q.x;
	self->y = q.y;
	self->z = q.z;

	return self;
}